

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
__thiscall Kernel::PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RealConstantType>>(PolyNf *this)

{
  byte bVar1;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *pSVar2;
  PolyNfSuper *pPVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *extraout_RDX;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_RSI;
  anon_class_16_2_f84bbffd f;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  PVar7;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> SStack_58;
  ulong local_38 [4];
  
  bVar1 = *(byte *)&(in_RSI->_summands)._capacity;
  if ((bVar1 & 3) == 2) {
    pSVar2 = &in_RSI->_summands;
    cVar4 = *(char *)((long)&pSVar2->_capacity + 3);
    cVar5 = *(char *)((long)&pSVar2->_capacity + 4);
    cVar6 = *(char *)((long)&pSVar2->_capacity + 5);
    pPVar3 = &this->super_PolyNfSuper;
    (pPVar3->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    .field_0x0 = *(char *)((long)&pSVar2->_capacity + 2);
    (pPVar3->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0] = cVar4;
    (pPVar3->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[1] = cVar5;
    (pPVar3->_inner).
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[2] = cVar6;
    *(undefined8 *)
     ((this->super_PolyNfSuper)._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      .
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      ._content + 7) = *(undefined8 *)((long)&(in_RSI->_summands)._stack + 2);
  }
  else {
    local_38[1] = 0;
    local_38[2] = 0;
    local_38[0] = (ulong)bVar1 & 0xffffffffffffff03;
    f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
               *)in_RSI;
    f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
              *)local_38;
    ::Lib::CoproductImpl::
    RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
              ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                *)local_38,f);
    Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
              ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&SStack_58,
               (PolyNf *)local_38);
    ::Lib::
    perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
              ((Lib *)this,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&SStack_58);
    ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&SStack_58);
    in_RSI = extraout_RDX;
  }
  PVar7._ptr = in_RSI;
  PVar7._0_8_ = this;
  return PVar7;
}

Assistant:

Perfect<Polynom<Number>> PolyNf::wrapPoly() const
{
  if (this->is<AnyPoly>()) {
    return this->unwrap<AnyPoly>()
            .unwrap<Perfect<Polynom<Number>>>();
  } else {
    return perfect(Polynom<Number>(*this));
  }
}